

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int container_and_cardinality(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar2 == 4) {
    uVar2 = (uint)*(byte *)((long)c1 + 8);
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    c2 = *c2;
  }
  iVar1 = (*(code *)(&DAT_0012c330 +
                    *(int *)(&DAT_0012c330 + (ulong)(((uint)type2 + (uVar2 & 0xff) * 4) - 5) * 4)))
                    (c1,&DAT_0012c330,c2,
                     &DAT_0012c330 +
                     *(int *)(&DAT_0012c330 + (ulong)(((uint)type2 + (uVar2 & 0xff) * 4) - 5) * 4));
  return iVar1;
}

Assistant:

static inline int container_and_cardinality(const container_t *c1,
                                            uint8_t type1,
                                            const container_t *c2,
                                            uint8_t type2) {
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET, BITSET):
            return bitset_container_and_justcard(const_CAST_bitset(c1),
                                                 const_CAST_bitset(c2));

        case CONTAINER_PAIR(ARRAY, ARRAY):
            return array_container_intersection_cardinality(
                const_CAST_array(c1), const_CAST_array(c2));

        case CONTAINER_PAIR(RUN, RUN):
            return run_container_intersection_cardinality(const_CAST_run(c1),
                                                          const_CAST_run(c2));

        case CONTAINER_PAIR(BITSET, ARRAY):
            return array_bitset_container_intersection_cardinality(
                const_CAST_array(c2), const_CAST_bitset(c1));

        case CONTAINER_PAIR(ARRAY, BITSET):
            return array_bitset_container_intersection_cardinality(
                const_CAST_array(c1), const_CAST_bitset(c2));

        case CONTAINER_PAIR(BITSET, RUN):
            return run_bitset_container_intersection_cardinality(
                const_CAST_run(c2), const_CAST_bitset(c1));

        case CONTAINER_PAIR(RUN, BITSET):
            return run_bitset_container_intersection_cardinality(
                const_CAST_run(c1), const_CAST_bitset(c2));

        case CONTAINER_PAIR(ARRAY, RUN):
            return array_run_container_intersection_cardinality(
                const_CAST_array(c1), const_CAST_run(c2));

        case CONTAINER_PAIR(RUN, ARRAY):
            return array_run_container_intersection_cardinality(
                const_CAST_array(c2), const_CAST_run(c1));

        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}